

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_find.hpp
# Opt level: O3

void __thiscall openjij::utility::UnionFind::UnionFind(UnionFind *this,size_type n)

{
  pointer puVar1;
  pointer puVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  allocator_type local_1a;
  allocator_type local_19;
  value_type_conflict1 local_18;
  long lVar8;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->_parent,n,&local_19);
  local_18 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->_rank,n,&local_18,&local_1a);
  auVar3 = _DAT_001d8020;
  puVar1 = (this->_parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (this->_parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    uVar4 = (long)puVar2 + (-8 - (long)puVar1);
    auVar9._8_4_ = (int)uVar4;
    auVar9._0_8_ = uVar4;
    auVar9._12_4_ = (int)(uVar4 >> 0x20);
    auVar6._0_8_ = uVar4 >> 3;
    auVar6._8_8_ = auVar9._8_8_ >> 3;
    uVar5 = 0;
    auVar6 = auVar6 ^ _DAT_001d8020;
    auVar7 = _DAT_001d8010;
    do {
      auVar9 = auVar7 ^ auVar3;
      if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                  auVar6._4_4_ < auVar9._4_4_) & 1)) {
        puVar1[uVar5] = uVar5;
      }
      if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
          auVar9._12_4_ <= auVar6._12_4_) {
        puVar1[uVar5 + 1] = uVar5 + 1;
      }
      uVar5 = uVar5 + 2;
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar8 + 2;
    } while (((uVar4 >> 3) + 2 & 0xfffffffffffffffe) != uVar5);
  }
  return;
}

Assistant:

explicit UnionFind(size_type n) : _parent(n), _rank(n, 0) {
    std::iota(_parent.begin(), _parent.end(), 0);
  }